

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::AutoScreenshot_Cleanup(CClient *this)

{
  long lVar1;
  CConfig *pCVar2;
  IStorage *pIVar3;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffbbe8;
  IStorage *in_stack_ffffffffffffbbf0;
  CClient *this_00;
  CClient *this_local;
  CFileCollection AutoScreens_1;
  CFileCollection AutoScreens;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  if ((this->m_AutoScreenshotRecycle & 1U) != 0) {
    pCVar2 = Config(this);
    if (pCVar2->m_ClAutoScreenshotMax != 0) {
      in_stack_ffffffffffffbbf0 = Storage(this_00);
      Config(this_00);
      CFileCollection::Init
                ((CFileCollection *)AutoScreens_1.m_aTimestamps[1],
                 (IStorage *)AutoScreens_1.m_aTimestamps[0],(char *)this,(char *)this_00,
                 (char *)in_stack_ffffffffffffbbf0,(int)((ulong)in_stack_ffffffffffffbbe8 >> 0x20));
    }
    this_00->m_AutoScreenshotRecycle = false;
  }
  if ((this_00->m_AutoStatScreenshotRecycle & 1U) != 0) {
    pCVar2 = Config(this_00);
    if (pCVar2->m_ClAutoScreenshotMax != 0) {
      pIVar3 = Storage(this_00);
      Config(this_00);
      CFileCollection::Init
                ((CFileCollection *)AutoScreens_1.m_aTimestamps[1],
                 (IStorage *)AutoScreens_1.m_aTimestamps[0],(char *)this,(char *)this_00,
                 (char *)in_stack_ffffffffffffbbf0,(int)((ulong)pIVar3 >> 0x20));
    }
    this_00->m_AutoStatScreenshotRecycle = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CClient::AutoScreenshot_Cleanup()
{
	if(m_AutoScreenshotRecycle)
	{
		if(Config()->m_ClAutoScreenshotMax)
		{
			// clean up auto taken screens
			CFileCollection AutoScreens;
			AutoScreens.Init(Storage(), "screenshots/auto", "autoscreen", ".png", Config()->m_ClAutoScreenshotMax);
		}
		m_AutoScreenshotRecycle = false;
	}
	if(m_AutoStatScreenshotRecycle)
	{
		if(Config()->m_ClAutoScreenshotMax)
		{
			// clean up auto taken stat screens
			CFileCollection AutoScreens;
			AutoScreens.Init(Storage(), "screenshots/auto", "stat", ".png", Config()->m_ClAutoScreenshotMax);
		}
		m_AutoStatScreenshotRecycle = false;
	}
}